

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnTry(SharedValidator *this,Location *loc,Type sig_type)

{
  Result rhs;
  Opcode local_68;
  Enum local_64;
  undefined1 local_60 [8];
  TypeVector result_types;
  TypeVector param_types;
  Location *loc_local;
  SharedValidator *this_local;
  Type sig_type_local;
  Result result;
  
  Opcode::Opcode((Opcode *)
                 ((long)&param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),Try);
  sig_type_local.enum_ =
       (Enum)CheckInstr(this,param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,loc);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
             &result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_60);
  Opcode::Opcode(&local_68,Try);
  local_64 = (Enum)CheckBlockSignature(this,loc,local_68,sig_type,
                                       (TypeVector *)
                                       &result_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (TypeVector *)local_60);
  Result::operator|=((Result *)&sig_type_local,(Result)local_64);
  rhs = TypeChecker::OnTry(&this->typechecker_,
                           (TypeVector *)
                           &result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (TypeVector *)local_60);
  Result::operator|=((Result *)&sig_type_local,rhs);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_60);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
             &result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (Result)sig_type_local.enum_;
}

Assistant:

Result SharedValidator::OnTry(const Location& loc, Type sig_type) {
  Result result = CheckInstr(Opcode::Try, loc);
  TypeVector param_types, result_types;
  result |= CheckBlockSignature(loc, Opcode::Try, sig_type, &param_types,
                                &result_types);
  result |= typechecker_.OnTry(param_types, result_types);
  return result;
}